

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::TypedefDeclarationSyntax::setChild
          (TypedefDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0048f1b8 + *(int *)(&DAT_0048f1b8 + index * 4)))();
  return;
}

Assistant:

void TypedefDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: typedefKeyword = child.token(); return;
        case 2: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 3: name = child.token(); return;
        case 4: dimensions = child.node()->as<SyntaxList<VariableDimensionSyntax>>(); return;
        case 5: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}